

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_qsbr.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2131d::QSBR_ReacquireLivePtrAfterQuiescentState_Test::TestBody
          (QSBR_ReacquireLivePtrAfterQuiescentState_Test *this)

{
  __uniq_ptr_impl<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_> _Var1;
  pointer ptr_;
  qsbr_thread *__stat_loc;
  char *message;
  thread local_58;
  qsbr_thread second_thread;
  AssertionResult gtest_ar;
  __uniq_ptr_impl<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_> local_38;
  __single_object new_qsbr_per_thread;
  
  unodb::test::QSBRTestBase::mark_epoch(&this->super_QSBR);
  ptr_ = (pointer)unodb::test::QSBRTestBase::allocate();
  *ptr_ = 'A';
  std::make_unique<unodb::qsbr_per_thread>();
  _Var1._M_t.
  super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>.
  super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl =
       local_38._M_t.
       super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>
       .super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl;
  local_38._M_t.
  super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>.
  super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl =
       (tuple<unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>)
       (_Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>)0x0
  ;
  new_qsbr_per_thread._M_t.
  super___uniq_ptr_impl<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_>._M_t.
  super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>.
  super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl =
       (__uniq_ptr_data<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>,_true,_true>
        )(__uniq_ptr_data<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>,_true,_true>
          )_Var1._M_t.
           super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>
           .super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  second_thread.super_thread._M_id._M_thread = (thread)operator_new(0x18);
  *(undefined ***)second_thread.super_thread._M_id._M_thread = &PTR___State_impl_00169808;
  new_qsbr_per_thread._M_t.
  super___uniq_ptr_impl<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_>._M_t.
  super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>.
  super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl =
       (__uniq_ptr_data<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>,_true,_true>
        )(__uniq_ptr_impl<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_>)0x0;
  *(pointer *)((long)second_thread.super_thread._M_id._M_thread + 8) = ptr_;
  ((__uniq_ptr_impl<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_> *)
  ((long)second_thread.super_thread._M_id._M_thread + 0x10))->_M_t =
       _Var1._M_t.
       super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>
       .super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl;
  __stat_loc = &second_thread;
  std::thread::_M_start_thread(&gtest_ar.message_,__stat_loc,0);
  if (second_thread.super_thread._M_id._M_thread != (id)0x0) {
    (**(code **)(*(long *)second_thread.super_thread._M_id._M_thread + 8))();
  }
  std::unique_ptr<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_>::~unique_ptr
            (&new_qsbr_per_thread);
  std::unique_ptr<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_>::~unique_ptr
            ((unique_ptr<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_> *)
             &local_38);
  local_58._M_id._M_thread =
       (id)(id)gtest_ar.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::thread::~thread((thread *)&gtest_ar.message_);
  unodb::detail::thread_sync::wait((thread_sync *)unodb::detail::thread_syncs,__stat_loc);
  unodb::test::QSBRTestBase::quiescent();
  unodb::test::QSBRTestBase::check_epoch_same(&this->super_QSBR);
  unodb::qsbr_ptr<char>::qsbr_ptr((qsbr_ptr<char> *)&local_38,ptr_);
  unodb::detail::thread_sync::notify((thread_sync *)(unodb::detail::thread_syncs + 0x60));
  unodb::detail::thread_sync::wait((thread_sync *)unodb::detail::thread_syncs,ptr_);
  unodb::test::must_not_allocate<unodb::test::QSBRTestBase::join(unodb::qsbr_thread&)::_lambda()_1_>
            ((qsbr_thread *)&local_58);
  unodb::test::QSBRTestBase::check_epoch_advanced(&this->super_QSBR);
  new_qsbr_per_thread._M_t.
  super___uniq_ptr_impl<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_>._M_t.
  super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>.
  super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl._0_1_ = 0x41;
  testing::internal::CmpHelperEQ<char,char>
            ((internal *)&second_thread,"(*active_ptr)","(\'A\')",
             (char *)local_38._M_t.
                     super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>
                     .super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl,
             (char *)&new_qsbr_per_thread);
  if ((char)second_thread.super_thread._M_id._M_thread == '\0') {
    testing::Message::Message((Message *)&new_qsbr_per_thread);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_qsbr.cpp"
               ,0x340,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&new_qsbr_per_thread);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if ((__uniq_ptr_impl<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_>)
        new_qsbr_per_thread._M_t.
        super___uniq_ptr_impl<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_>.
        _M_t.
        super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>
        .super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_>)0x0)
    {
      (**(code **)(*(long *)new_qsbr_per_thread._M_t.
                            super___uniq_ptr_impl<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>
                            .super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl + 8
                  ))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar);
    unodb::qsbr_ptr<char>::~qsbr_ptr((qsbr_ptr<char> *)&local_38);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar);
    unodb::qsbr_ptr<char>::~qsbr_ptr((qsbr_ptr<char> *)&local_38);
    unodb::test::QSBRTestBase::quiescent();
    unodb::test::QSBRTestBase::check_epoch_advanced(&this->super_QSBR);
  }
  std::thread::~thread(&local_58);
  return;
}

Assistant:

UNODB_TEST_F(QSBR, ReacquireLivePtrAfterQuiescentState) {
  mark_epoch();
  auto *const ptr = static_cast<char *>(allocate());
  touch_memory(ptr, 'A');

  unodb::qsbr_thread second_thread{[ptr] {
    thread_syncs[0].notify();  // 1 ->
    thread_syncs[1].wait();    // 2 <-

    qsbr_deallocate(ptr);

    thread_syncs[0].notify();  // 3 ->
  }};

  thread_syncs[0].wait();  // 1 <-

  // Wrote ptr to a shared data structure and done with it for now
  quiescent();

  check_epoch_same();

  {
    // Reacquired ptr from a shared data structure
    const unodb::qsbr_ptr<char> active_ptr{ptr};

    thread_syncs[1].notify();  // 2 ->
    thread_syncs[0].wait();    // 3 <-

    join(second_thread);

    check_epoch_advanced();

    UNODB_ASSERT_EQ(*active_ptr, 'A');
  }

  quiescent();

  check_epoch_advanced();
}